

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O1

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = current->_M_string_length;
  bVar2 = false;
  if (2 < uVar1) {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)current);
    iVar3 = ::std::__cxx11::string::compare((char *)local_50);
    bVar2 = false;
    if (iVar3 == 0) {
      bVar2 = valid_first_char<char>((current->_M_dataplus)._M_p[2]);
    }
  }
  if ((2 < uVar1) && (local_50[0] != local_40)) {
    operator_delete(local_50[0]);
  }
  if (bVar2 != false) {
    lVar4 = ::std::__cxx11::string::find((char *)current,0x15c2c4,0);
    if (lVar4 == -1) {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)current);
      ::std::__cxx11::string::operator=((string *)name,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x15b30e);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)current);
      ::std::__cxx11::string::operator=((string *)name,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)current);
      ::std::__cxx11::string::operator=((string *)value,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  }
  return bVar2;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find("=");
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    } else
        return false;
}